

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initkbd.c
# Opt level: O0

void keyboardtype(int fd)

{
  short sVar1;
  int iVar2;
  char local_e8 [8];
  char errmsg [200];
  char *key;
  uint local_10;
  int i;
  int type;
  int fd_local;
  
  InterfacePage->devconfig = InterfacePage->devconfig & 0xfff8;
  errmsg._192_8_ = getenv("LDEKBDTYPE");
  if ((char *)errmsg._192_8_ == (char *)0x0) {
    local_10 = 0xe;
  }
  else {
    iVar2 = strcmp("as3000j",(char *)errmsg._192_8_);
    if (iVar2 == 0) {
      local_10 = 10;
    }
    else {
      iVar2 = strcmp("type4",(char *)errmsg._192_8_);
      if (iVar2 == 0) {
        local_10 = 4;
      }
      else {
        iVar2 = strcmp("type2",(char *)errmsg._192_8_);
        if (iVar2 == 0) {
          local_10 = 2;
        }
        else {
          iVar2 = strcmp("jle",(char *)errmsg._192_8_);
          if (iVar2 == 0) {
            local_10 = 5;
          }
          else {
            iVar2 = strcmp("X",(char *)errmsg._192_8_);
            if ((iVar2 == 0) || (iVar2 = strcmp("x",(char *)errmsg._192_8_), iVar2 == 0)) {
              local_10 = 0xe;
            }
            else {
              iVar2 = strcmp("sdl",(char *)errmsg._192_8_);
              if (iVar2 == 0) {
                local_10 = 0x10;
              }
              else {
                local_10 = 3;
              }
            }
          }
        }
      }
    }
  }
  sVar1 = (short)local_10;
  switch(local_10) {
  case 2:
    SUNLispKeyMap = SUNLispKeyMap_for3;
    InterfacePage->devconfig = InterfacePage->devconfig;
    break;
  case 3:
    SUNLispKeyMap = SUNLispKeyMap_for3;
    InterfacePage->devconfig = InterfacePage->devconfig | sVar1 - 3U;
    break;
  case 4:
    SUNLispKeyMap = SUNLispKeyMap_for4;
    InterfacePage->devconfig = InterfacePage->devconfig | sVar1 - 3U;
    break;
  case 5:
    SUNLispKeyMap = SUNLispKeyMap_jle;
    InterfacePage->devconfig = InterfacePage->devconfig | sVar1 - 3U;
    break;
  default:
    sprintf(local_e8,"Unsupported keyboard type: %d",(ulong)local_10);
    printf("%s\n",local_e8);
    printf("Configuring keyboard for type-3\n");
    SUNLispKeyMap = SUNLispKeyMap_for3;
    InterfacePage->devconfig = InterfacePage->devconfig;
    break;
  case 10:
    SUNLispKeyMap = SUNLispKeyMap_for4;
    InterfacePage->devconfig = InterfacePage->devconfig | sVar1 - 3U;
    break;
  case 0xe:
    SUNLispKeyMap = make_X_keymap();
    XGenericKeyMap = SUNLispKeyMap;
    InterfacePage->devconfig = InterfacePage->devconfig;
  }
  return;
}

Assistant:

void keyboardtype(int fd)
{
  int type;
  int i;
  char *key;

#if defined(OS4)
  for (i = 0; i < 5000; i++) { /* IDLE LOOP */
  }                            /* because of a SunOS bug */
#endif

  /* clear the keyboard field in devconfig */
  InterfacePage->devconfig &= 0xfff8;

  /************************************************************
   Due to the problems of SunOS 4.0 & 4.0.1
   calling ioctl never return the correct keyboard type.
   So,these 2 lines are commented out ...(Take)->AR11100
  *************************************************************/

  /* Get keytype from LDEKBDTYPE  */
  if ((key = getenv("LDEKBDTYPE")) == 0) {
#ifdef XWINDOW
    type = KB_X;
#elif DOS
    type = KB_DOS;
#elif SDL
    type = KB_SDL;
#endif /* XWINDOW */
  } /* if end */
  else {
    if (strcmp("as3000j", key) == 0)
      type = KB_AS3000J;
    else if (strcmp("type4", key) == 0)
      type = KB_SUN4;
    else if (strcmp("type2", key) == 0)
      type = KB_SUN2;
    else if (strcmp("jle", key) == 0)
      type = KB_JLE;
    else if (strcmp("X", key) == 0 || strcmp("x", key) == 0)
      type = KB_X;
    else if (strcmp("sdl", key) == 0)
      type = KB_SDL;
    else
      type = KB_SUN3; /* default */
  }

  switch (type) {
    case KB_SUN2: /* type2, we still use keymap for type3 */
      SUNLispKeyMap = SUNLispKeyMap_for3;
      /* MIN_KEYTYPE is 3,so we can't set devconfig correctly */
      /* Therefore type2 may treat as type3 */
      InterfacePage->devconfig |= 0;
      break;
    case KB_SUN3: /* type3 */
      SUNLispKeyMap = SUNLispKeyMap_for3;
      InterfacePage->devconfig |= type - MIN_KEYTYPE;
      break;
    case KB_SUN4: /* type4 */
      SUNLispKeyMap = SUNLispKeyMap_for4;
      InterfacePage->devconfig |= type - MIN_KEYTYPE;
      break;
    case KB_JLE: /* JLE */
      /*printf("jle\n"); */
      SUNLispKeyMap = SUNLispKeyMap_jle;
      InterfacePage->devconfig |= type - MIN_KEYTYPE;
      /* InterfacePage->devconfig |= 4-MIN_KEYTYPE; */
      break;
    case KB_AS3000J: /* for AS, use type4 map */
      SUNLispKeyMap = SUNLispKeyMap_for4;
      InterfacePage->devconfig |= type - MIN_KEYTYPE; /* 7 */
      break;
#ifdef XWINDOW
    case KB_X:
      XGenericKeyMap = (u_char *)make_X_keymap();
      SUNLispKeyMap = XGenericKeyMap;
      InterfacePage->devconfig |= KB_SUN3 - MIN_KEYTYPE; /* 10 */
      break;
#endif /* XWINDOW */
#ifdef SDL
  case KB_SDL:
    InterfacePage->devconfig |= KB_SUN3 - MIN_KEYTYPE; /* 10 */
    break;
#endif /* SDL */
#ifdef DOS
    case KB_DOS:
      SUNLispKeyMap = DOSLispKeyMap_101;
      InterfacePage->devconfig |= KB_SUN3 - MIN_KEYTYPE; /* 10 */
      break;
#endif /* DOS */
    default: {
      char errmsg[200];
      sprintf(errmsg, "Unsupported keyboard type: %d", type);
      printf("%s\n", errmsg);
      printf("Configuring keyboard for type-3\n");
      SUNLispKeyMap = SUNLispKeyMap_for3;
      InterfacePage->devconfig |= KB_SUN3 - MIN_KEYTYPE;
      break;
    }
  }

}